

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_init_alloc(uint32_t version,uint32_t locktime,size_t inputs_allocation_len,
                       size_t outputs_allocation_len,wally_tx **output)

{
  wally_tx *pwVar1;
  wally_tx *result;
  wally_tx_output *new_outputs;
  wally_tx_input *new_inputs;
  wally_tx **output_local;
  size_t outputs_allocation_len_local;
  size_t inputs_allocation_len_local;
  uint32_t locktime_local;
  uint32_t version_local;
  
  new_outputs = (wally_tx_output *)0x0;
  result = (wally_tx *)0x0;
  if (output == (wally_tx **)0x0) {
    locktime_local = 0xfffffffe;
  }
  else {
    *output = (wally_tx *)0x0;
    pwVar1 = (wally_tx *)wally_calloc(0x38);
    *output = pwVar1;
    if (*output == (wally_tx *)0x0) {
      locktime_local = 0xfffffffd;
    }
    else {
      pwVar1 = *output;
      if (inputs_allocation_len != 0) {
        new_outputs = (wally_tx_output *)wally_malloc(inputs_allocation_len * 0xd0);
      }
      if (outputs_allocation_len != 0) {
        result = (wally_tx *)wally_malloc(outputs_allocation_len * 0x70);
      }
      if (((inputs_allocation_len == 0) || (new_outputs != (wally_tx_output *)0x0)) &&
         ((outputs_allocation_len == 0 || (result != (wally_tx *)0x0)))) {
        pwVar1->version = version;
        pwVar1->locktime = locktime;
        pwVar1->inputs = (wally_tx_input *)new_outputs;
        pwVar1->num_inputs = 0;
        pwVar1->inputs_allocation_len = inputs_allocation_len;
        pwVar1->outputs = (wally_tx_output *)result;
        pwVar1->num_outputs = 0;
        pwVar1->outputs_allocation_len = outputs_allocation_len;
        locktime_local = 0;
      }
      else {
        wally_free(new_outputs);
        wally_free(result);
        wally_free(pwVar1);
        *output = (wally_tx *)0x0;
        locktime_local = 0xfffffffd;
      }
    }
  }
  return locktime_local;
}

Assistant:

int wally_tx_init_alloc(uint32_t version, uint32_t locktime,
                        size_t inputs_allocation_len,
                        size_t outputs_allocation_len,
                        struct wally_tx **output)
{
    struct wally_tx_input *new_inputs = NULL;
    struct wally_tx_output *new_outputs = NULL;
    struct wally_tx *result;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_tx);

    if (inputs_allocation_len)
        new_inputs = wally_malloc(inputs_allocation_len * sizeof(struct wally_tx_input));
    if (outputs_allocation_len)
        new_outputs = wally_malloc(outputs_allocation_len * sizeof(struct wally_tx_output));
    if ((inputs_allocation_len && !new_inputs) ||
        (outputs_allocation_len && !new_outputs)) {
        wally_free(new_inputs);
        wally_free(new_outputs);
        wally_free(result);
        *output = NULL;
        return WALLY_ENOMEM;
    }

    result->version = version;
    result->locktime = locktime;
    result->inputs = new_inputs;
    result->num_inputs = 0;
    result->inputs_allocation_len = inputs_allocation_len;
    result->outputs = new_outputs;
    result->num_outputs = 0;
    result->outputs_allocation_len = outputs_allocation_len;
    return WALLY_OK;
}